

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O3

tmsize_t TIFFReadRawTile1(TIFF *tif,uint32_t tile,void *buf,tmsize_t size,char *module)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint64_t off;
  tmsize_t tVar4;
  uint64_t uVar5;
  long lVar6;
  
  uVar1 = tif->tif_flags;
  if ((uVar1 >> 0x11 & 1) != 0) {
    __assert_fail("(tif->tif_flags & TIFF_NOREADRAW) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibTiff/tif_read.c"
                  ,0x444,
                  "tmsize_t TIFFReadRawTile1(TIFF *, uint32_t, void *, tmsize_t, const char *)");
  }
  off = TIFFGetStrileOffset(tif,tile);
  if ((uVar1 >> 0xb & 1) == 0) {
    iVar3 = _TIFFSeekOK(tif,off);
    if (iVar3 == 0) {
      TIFFErrorExtR(tif,module,"Seek error at row %u, col %u, tile %u",(ulong)tif->tif_row,
                    (ulong)tif->tif_col,tile);
    }
    else {
      tVar4 = (*tif->tif_readproc)(tif->tif_clientdata,buf,size);
      if (tVar4 == size) {
        return size;
      }
      TIFFErrorExtR(tif,module,"Read error at row %u, col %u; got %ld bytes, expected %ld",
                    (ulong)tif->tif_row,(ulong)tif->tif_col,tVar4,size);
    }
LAB_002b0c45:
    size = -1;
  }
  else {
    uVar5 = TIFFGetStrileOffset(tif,tile);
    if ((long)uVar5 < 0) {
LAB_002b0be8:
      lVar6 = 0;
LAB_002b0beb:
      if (lVar6 != size) {
        TIFFErrorExtR(tif,module,
                      "Read error at row %u, col %u, tile %u; got %ld bytes, expected %ld",
                      (ulong)tif->tif_row,(ulong)tif->tif_col,tile,lVar6,size);
        goto LAB_002b0c45;
      }
    }
    else {
      lVar2 = tif->tif_size;
      lVar6 = lVar2 - off;
      if (lVar2 < (long)off) goto LAB_002b0be8;
      if (lVar2 < (long)(size + off) || (long)(off | size) < 0) goto LAB_002b0beb;
    }
    _TIFFmemcpy(buf,tif->tif_base + off,size);
  }
  return size;
}

Assistant:

static tmsize_t TIFFReadRawTile1(TIFF *tif, uint32_t tile, void *buf,
                                 tmsize_t size, const char *module)
{
    assert((tif->tif_flags & TIFF_NOREADRAW) == 0);
    if (!isMapped(tif))
    {
        tmsize_t cc;

        if (!SeekOK(tif, TIFFGetStrileOffset(tif, tile)))
        {
            TIFFErrorExtR(tif, module,
                          "Seek error at row %" PRIu32 ", col %" PRIu32
                          ", tile %" PRIu32,
                          tif->tif_row, tif->tif_col, tile);
            return ((tmsize_t)(-1));
        }
        cc = TIFFReadFile(tif, buf, size);
        if (cc != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at row %" PRIu32 ", col %" PRIu32
                          "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, tif->tif_col, cc, size);
            return ((tmsize_t)(-1));
        }
    }
    else
    {
        tmsize_t ma, mb;
        tmsize_t n;
        ma = (tmsize_t)TIFFGetStrileOffset(tif, tile);
        mb = ma + size;
        if ((TIFFGetStrileOffset(tif, tile) > (uint64_t)TIFF_TMSIZE_T_MAX) ||
            (ma > tif->tif_size))
            n = 0;
        else if ((mb < ma) || (mb < size) || (mb > tif->tif_size))
            n = tif->tif_size - ma;
        else
            n = size;
        if (n != size)
        {
            TIFFErrorExtR(tif, module,
                          "Read error at row %" PRIu32 ", col %" PRIu32
                          ", tile %" PRIu32 "; got %" TIFF_SSIZE_FORMAT
                          " bytes, expected %" TIFF_SSIZE_FORMAT,
                          tif->tif_row, tif->tif_col, tile, n, size);
            return ((tmsize_t)(-1));
        }
        _TIFFmemcpy(buf, tif->tif_base + ma, size);
    }
    return (size);
}